

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O0

void make_bins(float32 *values,uint32 values_num,float32 *centers,uint32 bins)

{
  float *pfVar1;
  float32 local_54;
  float *local_48;
  float32 *ptr;
  float32 sum;
  uint32 i;
  float32 *start;
  float32 *finish;
  float32 *pfStack_20;
  uint32 bins_local;
  float32 *centers_local;
  uint32 values_num_local;
  float32 *values_local;
  
  qsort(values,(ulong)values_num,4,weights_comparator);
  _sum = values;
  pfStack_20 = centers;
  for (ptr._4_4_ = 0; ptr._4_4_ < bins; ptr._4_4_ = ptr._4_4_ + 1) {
    pfVar1 = (float *)(values + ((ulong)values_num * (ulong)(ptr._4_4_ + 1)) / (ulong)bins);
    if (pfVar1 == (float *)_sum) {
      if (ptr._4_4_ == 0) {
        local_54 = -2.139095e+09;
      }
      else {
        local_54 = pfStack_20[-1];
      }
      *pfStack_20 = local_54;
    }
    else {
      ptr._0_4_ = 0.0;
      for (local_48 = (float *)_sum; local_48 != pfVar1; local_48 = local_48 + 1) {
        ptr._0_4_ = *local_48 + ptr._0_4_;
      }
      *pfStack_20 = (float32)(ptr._0_4_ / (float)((long)pfVar1 - (long)_sum >> 2));
    }
    pfStack_20 = pfStack_20 + 1;
    _sum = (float32 *)pfVar1;
  }
  return;
}

Assistant:

static void
make_bins(float32 *values, uint32 values_num, float32 *centers, uint32 bins)
{
    float32 *finish, *start;
    uint32 i;

    qsort(values, values_num, sizeof(*values), &weights_comparator);
    start = values;
    for (i = 0; i < bins; i++, centers++, start = finish) {
        finish = values + (size_t) ((uint64) values_num * (i + 1) / bins);
        if (finish == start) {
            /* zero length bucket. */
            *centers = i ? *(centers - 1) : -FLOAT_INF;
        }
        else {
            float32 sum = 0.0f;
            float32 *ptr;
            for (ptr = start; ptr != finish; ptr++) {
                sum += *ptr;
            }
            *centers = sum / (float32) (finish - start);
        }
    }
}